

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

string * CLI::detail::convert_arg_for_ini
                   (string *__return_storage_ptr__,string *arg,char stringQuote,char literalQuote,
                   bool disable_multi_line)

{
  byte bVar1;
  byte *pbVar2;
  size_type sVar3;
  pointer pcVar4;
  undefined1 *puVar5;
  string *psVar6;
  bool bVar7;
  int iVar8;
  long lVar9;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var10;
  long *plVar11;
  size_type *psVar12;
  char *pcVar13;
  double val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  if (arg->_M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,'\x02');
    return __return_storage_ptr__;
  }
  iVar8 = ::std::__cxx11::string::compare((char *)arg);
  if ((((iVar8 == 0) || (iVar8 = ::std::__cxx11::string::compare((char *)arg), iVar8 == 0)) ||
      (iVar8 = ::std::__cxx11::string::compare((char *)arg), iVar8 == 0)) ||
     (iVar8 = ::std::__cxx11::string::compare((char *)arg), iVar8 == 0)) goto LAB_0011026b;
  iVar8 = ::std::__cxx11::string::compare((ulong)arg,0,(char *)0x2);
  if ((iVar8 != 0) &&
     (iVar8 = ::std::__cxx11::string::compare((ulong)arg,0,(char *)0x2), iVar8 != 0)) {
    local_70._M_dataplus._M_p = (pointer)0x0;
    bVar7 = lexical_cast<double,_(CLI::detail::enabler)0>(arg,(double *)&local_70);
    if ((bVar7) &&
       (lVar9 = ::std::__cxx11::string::find_first_not_of((char *)arg,0x144a66,0), lVar9 == -1))
    goto LAB_0011026b;
  }
  pbVar2 = (byte *)(arg->_M_dataplus)._M_p;
  sVar3 = arg->_M_string_length;
  if (sVar3 == 1) {
    iVar8 = isprint((uint)*pbVar2);
    if (iVar8 == 0) goto LAB_0011025e;
    iVar8 = ::std::__cxx11::string::compare((char *)arg);
    if (iVar8 == 0) {
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      ::std::__cxx11::string::_M_construct((ulong)&local_90,'\x01');
      plVar11 = (long *)::std::__cxx11::string::append((char *)&local_90);
      psVar12 = (size_type *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_70.field_2._M_allocated_capacity = *psVar12;
        local_70.field_2._8_8_ = plVar11[3];
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      }
      else {
        local_70.field_2._M_allocated_capacity = *psVar12;
        local_70._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_70._M_string_length = plVar11[1];
      *plVar11 = (long)psVar12;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      ::std::operator+(__return_storage_ptr__,&local_70,stringQuote);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p == &local_90.field_2) {
        return __return_storage_ptr__;
      }
      goto LAB_00110424;
    }
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    ::std::__cxx11::string::_M_construct((ulong)&local_90,'\x01');
    ::std::operator+(&local_70,&local_90,arg);
    ::std::operator+(__return_storage_ptr__,&local_70,literalQuote);
    goto LAB_001103b8;
  }
  if (*pbVar2 == 0x30) {
    bVar1 = pbVar2[1];
    if (bVar1 == 0x62) {
      _Var10 = ::std::
               __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_negate<CLI::detail::convert_arg_for_ini(std::__cxx11::string_const&,char,char,bool)::_lambda(char)_3_>>
                         (pbVar2 + 2,pbVar2 + sVar3);
    }
    else if (bVar1 == 0x6f) {
      _Var10 = ::std::
               __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_negate<CLI::detail::convert_arg_for_ini(std::__cxx11::string_const&,char,char,bool)::_lambda(char)_2_>>
                         (pbVar2 + 2,pbVar2 + sVar3);
    }
    else {
      if (bVar1 != 0x78) goto LAB_00110247;
      _Var10 = ::std::
               __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_negate<CLI::detail::convert_arg_for_ini(std::__cxx11::string_const&,char,char,bool)::_lambda(char)_1_>>
                         (pbVar2 + 2,pbVar2 + sVar3);
    }
    if ((byte *)_Var10._M_current == pbVar2 + sVar3) {
LAB_0011026b:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar4 = (arg->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar4,pcVar4 + arg->_M_string_length);
      return __return_storage_ptr__;
    }
  }
LAB_00110247:
  pcVar4 = (arg->_M_dataplus)._M_p;
  pcVar13 = pcVar4 + arg->_M_string_length;
  _Var10 = ::std::
           __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_negate<CLI::detail::is_printable(std::__cxx11::string_const&)::_lambda(char)_1_>>
                     (pcVar4,pcVar13);
  if (_Var10._M_current != pcVar13) {
LAB_0011025e:
    binary_escape_string(__return_storage_ptr__,arg);
    return __return_storage_ptr__;
  }
  lVar9 = ::std::__cxx11::string::find_first_of((char *)arg,escapedChars_abi_cxx11_,0);
  if (lVar9 == -1) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    ::std::__cxx11::string::_M_construct((ulong)&local_90,'\x01');
    ::std::operator+(&local_70,&local_90,arg);
    ::std::operator+(__return_storage_ptr__,&local_70,stringQuote);
LAB_001103b8:
    psVar6 = &local_70;
  }
  else {
    if (100 < arg->_M_string_length && !disable_multi_line) {
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"\'\'\'","");
      ::std::operator+(&local_70,&local_90,arg);
      ::std::operator+(__return_storage_ptr__,&local_70,"\'\'\'");
      goto LAB_001103b8;
    }
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    ::std::__cxx11::string::_M_construct((ulong)&local_90,'\x01');
    add_escaped_characters(&local_50,arg);
    ::std::operator+(&local_70,&local_90,&local_50);
    ::std::operator+(__return_storage_ptr__,&local_70,stringQuote);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    psVar6 = &local_50;
  }
  puVar5 = (undefined1 *)(&(psVar6->field_2)._M_allocated_capacity)[-2];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar5 != &psVar6->field_2) {
    operator_delete(puVar5);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p == &local_90.field_2) {
    return __return_storage_ptr__;
  }
LAB_00110424:
  operator_delete(local_90._M_dataplus._M_p);
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::string
convert_arg_for_ini(const std::string &arg, char stringQuote, char literalQuote, bool disable_multi_line) {
    if(arg.empty()) {
        return std::string(2, stringQuote);
    }
    // some specifically supported strings
    if(arg == "true" || arg == "false" || arg == "nan" || arg == "inf") {
        return arg;
    }
    // floating point conversion can convert some hex codes, but don't try that here
    if(arg.compare(0, 2, "0x") != 0 && arg.compare(0, 2, "0X") != 0) {
        using CLI::detail::lexical_cast;
        double val = 0.0;
        if(lexical_cast(arg, val)) {
            if(arg.find_first_not_of("0123456789.-+eE") == std::string::npos) {
                return arg;
            }
        }
    }
    // just quote a single non numeric character
    if(arg.size() == 1) {
        if(isprint(static_cast<unsigned char>(arg.front())) == 0) {
            return binary_escape_string(arg);
        }
        if(arg == "'") {
            return std::string(1, stringQuote) + "'" + stringQuote;
        }
        return std::string(1, literalQuote) + arg + literalQuote;
    }
    // handle hex, binary or octal arguments
    if(arg.front() == '0') {
        if(arg[1] == 'x') {
            if(std::all_of(arg.begin() + 2, arg.end(), [](char x) {
                   return (x >= '0' && x <= '9') || (x >= 'A' && x <= 'F') || (x >= 'a' && x <= 'f');
               })) {
                return arg;
            }
        } else if(arg[1] == 'o') {
            if(std::all_of(arg.begin() + 2, arg.end(), [](char x) { return (x >= '0' && x <= '7'); })) {
                return arg;
            }
        } else if(arg[1] == 'b') {
            if(std::all_of(arg.begin() + 2, arg.end(), [](char x) { return (x == '0' || x == '1'); })) {
                return arg;
            }
        }
    }
    if(!is_printable(arg)) {
        return binary_escape_string(arg);
    }
    if(detail::has_escapable_character(arg)) {
        if(arg.size() > 100 && !disable_multi_line) {
            return std::string(multiline_literal_quote) + arg + multiline_literal_quote;
        }
        return std::string(1, stringQuote) + detail::add_escaped_characters(arg) + stringQuote;
    }
    return std::string(1, stringQuote) + arg + stringQuote;
}